

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O3

void class_test(char *filename,FILE *fp)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  uint *order;
  ulong uVar6;
  uint uc;
  wchar_t wVar7;
  long lVar8;
  wchar_t *pwVar9;
  uint lineno;
  size_t order_len;
  char *p;
  size_t order_size;
  size_t bcs_size;
  uint representatives [23];
  bidi_char *local_d8;
  size_t local_d0;
  char *local_c8;
  char *local_c0;
  ulong local_b8;
  FILE *local_b0;
  size_t local_a8 [2];
  wchar_t local_98 [26];
  
  local_a8[1] = 0;
  local_a8[0] = 0;
  local_98[0x14] = 0;
  local_98[0x15] = L'\0';
  local_98[0x16] = L'\0';
  local_98[0x10] = L'\0';
  local_98[0x11] = L'\0';
  local_98[0x12] = 0;
  local_98[0x13] = 0;
  local_98[0xc] = L'\0';
  local_98[0xd] = L'\0';
  local_98[0xe] = L'\0';
  local_98[0xf] = L'\0';
  local_98[8] = L'\0';
  local_98[9] = L'\0';
  local_98[10] = L'\0';
  local_98[0xb] = L'\0';
  local_98[4] = L'\0';
  local_98[5] = L'\0';
  local_98[6] = L'\0';
  local_98[7] = L'\0';
  local_98[0] = L'\0';
  local_98[1] = L'\0';
  local_98[2] = L'\0';
  local_98[3] = L'\0';
  wVar7 = L'\x01';
  local_c0 = filename;
  do {
    bVar1 = bidi_getType(wVar7);
    if ((local_98[bVar1] == L'\0') ||
       ((iVar3 = mk_wcwidth(local_98[bVar1]), iVar3 < 1 && (iVar3 = mk_wcwidth(wVar7), 0 < iVar3))))
    {
      local_98[bVar1] = wVar7;
    }
    wVar7 = wVar7 + L'\x01';
  } while (wVar7 != L'\x00110000');
  pcVar4 = fgetline(fp);
  pcVar4 = chomp(pcVar4);
  if (pcVar4 == (char *)0x0) {
    order = (uint *)0x0;
    local_d8 = (bidi_char *)0x0;
  }
  else {
    lineno = 1;
    local_d8 = (bidi_char *)0x0;
    order_len = 0;
    order = (uint *)0x0;
    local_b0 = fp;
    do {
      if ((*pcVar4 == '#') || (*pcVar4 == '\0')) {
LAB_00101590:
        safefree(pcVar4);
      }
      else {
        _Var2 = strstartswith(pcVar4,"@Reorder:");
        if (!_Var2) {
          _Var2 = strstartswith(pcVar4,"@Levels:");
          if (!_Var2) {
            pcVar5 = strchr(pcVar4,0x3b);
            if (pcVar5 == (char *)0x0) {
              printf("%s:%u: bad test line\': no bitmap\n",local_c0,(ulong)lineno);
            }
            else {
              *pcVar5 = '\0';
              local_b8 = strtoul(pcVar5 + 1,(char **)0x0,0);
              local_c8 = pcVar4;
              pcVar5 = extract_word(&local_c8);
              if (*pcVar5 == '\0') {
                local_d0 = 0;
              }
              else {
                local_d0 = 0;
                do {
                  lVar8 = 0;
                  pwVar9 = local_98;
                  while (iVar3 = strcmp(pcVar5,*(char **)((long)typenames + lVar8)), iVar3 != 0) {
                    pwVar9 = pwVar9 + 1;
                    lVar8 = lVar8 + 8;
                    if (lVar8 == 0xb8) {
                      printf("%s:%u: bad test line: bad bidi type \'%s\'\n",local_c0,(ulong)lineno,
                             pcVar5);
                      fp = local_b0;
                      goto LAB_00101590;
                    }
                  }
                  local_d8 = (bidi_char *)safegrowarray(local_d8,local_a8 + 1,0xc,local_d0,1,false);
                  wVar7 = *pwVar9;
                  local_d8[local_d0].wc = wVar7;
                  local_d8[local_d0].origwc = wVar7;
                  local_d8[local_d0].index = (unsigned_short)local_d0;
                  local_d8[local_d0].nchars = 1;
                  local_d0 = local_d0 + 1;
                  pcVar5 = extract_word(&local_c8);
                } while (*pcVar5 != '\0');
              }
              if ((local_b8 & 1) != 0) {
                run_test(local_c0,lineno,local_d8,local_d0,order,order_len,0);
              }
              fp = local_b0;
              if ((local_b8 & 2) != 0) {
                run_test(local_c0,lineno,local_d8,local_d0,order,order_len,1);
              }
              if ((local_b8 & 4) != 0) {
                run_test(local_c0,lineno,local_d8,local_d0,order,order_len,-1);
              }
            }
          }
          goto LAB_00101590;
        }
        local_c8 = pcVar4;
        extract_word(&local_c8);
        pcVar5 = extract_word(&local_c8);
        if (*pcVar5 == '\0') {
          order_len = 0;
        }
        else {
          order_len = 0;
          do {
            order = (uint *)safegrowarray(order,local_a8,4,order_len,1,false);
            uVar6 = strtoul(pcVar5,(char **)0x0,0);
            order[order_len] = (uint)uVar6;
            order_len = order_len + 1;
            pcVar5 = extract_word(&local_c8);
          } while (*pcVar5 != '\0');
        }
        safefree(pcVar4);
        fp = local_b0;
      }
      lineno = lineno + 1;
      pcVar4 = fgetline(fp);
      pcVar4 = chomp(pcVar4);
    } while (pcVar4 != (char *)0x0);
  }
  safefree(local_d8);
  safefree(order);
  return;
}

Assistant:

static void class_test(const char *filename, FILE *fp)
{
    unsigned lineno = 0;
    size_t bcs_size = 0, bcs_len = 0;
    bidi_char *bcs = NULL;
    size_t order_size = 0, order_len = 0;
    unsigned *order = NULL;

    /* Preliminary: find a representative character of every bidi
     * type. Prefer positive-width ones if available. */
    unsigned representatives[N_BIDI_TYPES];
    for (size_t i = 0; i < N_BIDI_TYPES; i++)
        representatives[i] = 0;
    for (unsigned uc = 1; uc < 0x110000; uc++) {
        unsigned type = bidi_getType(uc);
        if (!representatives[type] ||
            (mk_wcwidth(representatives[type]) <= 0 && mk_wcwidth(uc) > 0))
            representatives[type] = uc;
    }

    while (true) {
        lineno++;
        char *line = chomp(fgetline(fp));
        if (!line)
            break;

        /* Skip blank lines and comments */
        if (!line[0] || line[0] == '#') {
            sfree(line);
            continue;
        }

        /* Parse @Reorder lines, which tell us the expected output
         * order for all following test cases (until superseded) */
        if (strstartswith(line, "@Reorder:")) {
            char *p = line;
            extract_word(&p); /* eat the "@Reorder:" header itself */
            order_len = 0;
            while (1) {
                const char *word = extract_word(&p);
                if (!*word)
                    break;
                sgrowarray(order, order_size, order_len);
                order[order_len++] = strtoul(word, NULL, 0);
            }

            sfree(line);
            continue;
        }

        /* Skip @Levels lines, which we don't (yet?) do anything with */
        if (strstartswith(line, "@Levels:")) {
            sfree(line);
            continue;
        }

        /* Everything remaining should be an actual test */
        char *semicolon = strchr(line, ';');
        if (!semicolon) {
            printf("%s:%u: bad test line': no bitmap\n", filename, lineno);
            sfree(line);
            continue;
        }
        *semicolon++ = '\0';
        unsigned bitmask = strtoul(semicolon, NULL, 0);
        char *p = line;
        bcs_len = 0;
        bool test_ok = true;
        while (1) {
            const char *word = extract_word(&p);
            if (!*word)
                break;
            unsigned type;
            for (type = 0; type < N_BIDI_TYPES; type++)
                if (!strcmp(word, typenames[type]))
                    break;
            if (type == N_BIDI_TYPES) {
                printf("%s:%u: bad test line: bad bidi type '%s'\n",
                       filename, lineno, word);
                test_ok = false;
                break;
            }
            sgrowarray(bcs, bcs_size, bcs_len);
            bcs[bcs_len].wc = representatives[type];
            bcs[bcs_len].origwc = bcs[bcs_len].wc;
            bcs[bcs_len].index = bcs_len;
            bcs[bcs_len].nchars = 1;
            bcs_len++;
        }

        if (!test_ok) {
            sfree(line);
            continue;
        }

        if (bitmask & 1)
            run_test(filename, lineno, bcs, bcs_len, order, order_len, 0);
        if (bitmask & 2)
            run_test(filename, lineno, bcs, bcs_len, order, order_len, +1);
        if (bitmask & 4)
            run_test(filename, lineno, bcs, bcs_len, order, order_len, -1);

        sfree(line);
    }

    sfree(bcs);
    sfree(order);
}